

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,FadExpr<FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>_> *fadexpr)

{
  uint ssize;
  double *pdVar1;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  double dVar5;
  value_type vVar6;
  double dVar7;
  
  ssize = (((fadexpr->fadexpr_).expr_)->fadexpr_).expr_.dx_.num_elts;
  if (ssize != (this->dx_).num_elts) {
    Vector<double>::resize(&this->dx_,ssize);
  }
  if (ssize != 0) {
    pdVar1 = (this->dx_).ptr_to_data;
    uVar3 = 0;
    if (0 < (int)ssize) {
      uVar3 = (ulong)ssize;
    }
    if ((((fadexpr->fadexpr_).expr_)->fadexpr_).expr_.dx_.num_elts == 0) {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        vVar6 = FadUnaryMin<FadExpr<FadFuncSin<Fad<double>_>_>_>::dx(&fadexpr->fadexpr_,(int)uVar4);
        pdVar1[uVar4] = vVar6;
      }
    }
    else {
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pFVar2 = (fadexpr->fadexpr_).expr_;
        dVar7 = (pFVar2->fadexpr_).expr_.dx_.ptr_to_data[uVar4];
        dVar5 = cos((pFVar2->fadexpr_).expr_.val_);
        pdVar1[uVar4] = dVar5 * -dVar7;
      }
    }
  }
  dVar7 = sin((((fadexpr->fadexpr_).expr_)->fadexpr_).expr_.val_);
  this->val_ = -dVar7;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}